

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O0

ssize_t tnt_object_add_float(tnt_stream *s,float value)

{
  long lVar1;
  char *pcVar2;
  ssize_t sVar3;
  char *end;
  long *plStack_20;
  char data [6];
  tnt_sbuf_object *sbo;
  float value_local;
  tnt_stream *s_local;
  
  plStack_20 = *(long **)((long)s->data + 0x30);
  if ((char)plStack_20[1] != '\0') {
    lVar1 = *plStack_20 + (long)(int)(*(byte *)(plStack_20 + 1) - 1) * 0x10;
    *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
  }
  pcVar2 = mp_encode_float((char *)((long)&end + 2),value);
  sVar3 = (*s->write)(s,(char *)((long)&end + 2),(long)pcVar2 - ((long)&end + 2));
  return sVar3;
}

Assistant:

ssize_t
tnt_object_add_float (struct tnt_stream *s, float value)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	char data[6], *end;
	end = mp_encode_float(data, value);
	return s->write(s, data, end - data);
}